

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

bool units::precise::custom::is_custom_unit_inverted(unit_data *UT)

{
  int iVar1;
  int key;
  unit_data *UT_local;
  
  iVar1 = detail::unit_data::meter(UT);
  if (iVar1 < 0) {
    return true;
  }
  if (0 < iVar1) {
    return false;
  }
  iVar1 = detail::unit_data::kg(UT);
  if (iVar1 + 3U < 2) {
LAB_001e4573:
    UT_local._7_1_ = false;
  }
  else {
    if (iVar1 != -1) {
      if (iVar1 == 1) goto LAB_001e4573;
      if (1 < iVar1 - 2U) {
        iVar1 = detail::unit_data::second(UT);
        if (iVar1 + 7U < 2) {
          return true;
        }
        if (iVar1 != -1) {
          if (iVar1 == 1) {
            return true;
          }
          if (1 < iVar1 - 6U) {
            iVar1 = detail::unit_data::ampere(UT);
            return iVar1 == 3;
          }
        }
        return false;
      }
    }
    UT_local._7_1_ = true;
  }
  return UT_local._7_1_;
}

Assistant:

inline bool is_custom_unit_inverted(const detail::unit_data& UT)
        {
            int key = UT.meter();
            if (key < 0) {
                return true;
            }
            if (key > 0) {
                return false;
            }
            key = UT.kg();
            switch (key) {
                case 1:
                case -2:
                case -3:
                    return false;
                case -1:
                case 2:
                case 3:
                    return true;
                default:
                    break;
            }
            key = UT.second();
            switch (key) {
                case 1:
                case -7:
                case -6:
                    return true;
                case -1:
                case 7:
                case 6:
                    return false;
                default:
                    break;
            }
            return (UT.ampere() == 3);
        }